

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O3

void check_lcp_and_cache<unsigned_int>
               (uchar *latest,uchar *from0,lcp_t lcp0,uint cache0,uchar *from1,lcp_t lcp1,
               uint cache1)

{
  uchar uVar1;
  uint uVar2;
  size_t i;
  lcp_t lVar3;
  uchar uVar4;
  
  uVar1 = *latest;
  if (uVar1 == '\0') {
    if (lcp0 != 0) goto LAB_001d234a;
    lVar3 = 0;
  }
  else {
    lVar3 = 0;
    uVar4 = uVar1;
    do {
      if (uVar4 != from0[lVar3]) break;
      uVar4 = latest[lVar3 + 1];
      lVar3 = lVar3 + 1;
    } while (uVar4 != '\0');
    if (lVar3 != lcp0) {
LAB_001d234a:
      __assert_fail("lcp(latest, from0) == lcp0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x41b,
                    "void check_lcp_and_cache(unsigned char *, unsigned char *, lcp_t, CharT, unsigned char *, lcp_t, CharT) [CharT = unsigned int]"
                   );
    }
    lVar3 = 0;
    do {
      if (uVar1 != from1[lVar3]) break;
      uVar1 = latest[lVar3 + 1];
      lVar3 = lVar3 + 1;
    } while (uVar1 != '\0');
  }
  if (lVar3 != lcp1) {
    __assert_fail("lcp(latest, from1) == lcp1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x41c,
                  "void check_lcp_and_cache(unsigned char *, unsigned char *, lcp_t, CharT, unsigned char *, lcp_t, CharT) [CharT = unsigned int]"
                 );
  }
  if (from0 != (uchar *)0x0) {
    if (from0[lcp0] == 0) {
      uVar2 = 0;
    }
    else {
      uVar2 = (uint)from0[lcp0] << 0x18;
      if (from0[lcp0 + 1] != 0) {
        uVar2 = uVar2 | (uint)from0[lcp0 + 1] << 0x10;
        if (from0[lcp0 + 2] != '\0') {
          uVar2 = uVar2 | CONCAT11(from0[lcp0 + 2],from0[lcp0 + 3]);
        }
      }
    }
    if (uVar2 != cache0) {
      __assert_fail("get_char<CharT>(from0, lcp0) == cache0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x41d,
                    "void check_lcp_and_cache(unsigned char *, unsigned char *, lcp_t, CharT, unsigned char *, lcp_t, CharT) [CharT = unsigned int]"
                   );
    }
    if (from1 != (uchar *)0x0) {
      if (from1[lcp1] == 0) {
        uVar2 = 0;
      }
      else {
        uVar2 = (uint)from1[lcp1] << 0x18;
        if (from1[lcp1 + 1] != 0) {
          uVar2 = uVar2 | (uint)from1[lcp1 + 1] << 0x10;
          if (from1[lcp1 + 2] != '\0') {
            uVar2 = uVar2 | CONCAT11(from1[lcp1 + 2],from1[lcp1 + 3]);
          }
        }
      }
      if (uVar2 != cache1) {
        __assert_fail("get_char<CharT>(from1, lcp1) == cache1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x41e,
                      "void check_lcp_and_cache(unsigned char *, unsigned char *, lcp_t, CharT, unsigned char *, lcp_t, CharT) [CharT = unsigned int]"
                     );
      }
      return;
    }
  }
  __assert_fail("ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                ,0x38,"uint32_t get_char(unsigned char *, size_t)");
}

Assistant:

static void
check_lcp_and_cache(unsigned char* latest,
                    unsigned char* from0, lcp_t lcp0, CharT cache0,
                    unsigned char* from1, lcp_t lcp1, CharT cache1)
{
	(void) latest;
	(void) from0; (void) lcp0; (void) cache0;
	(void) from1; (void) lcp1; (void) cache1;
	/*debug()<<"******** CHECK ********\n"
	       <<"Latest: '"<<latest<<"'\n"
	       <<"     0: '"<<from0<<"', lcp="<<lcp0<<", cache="<<to_str(cache0)<<"\n"
	       <<"     1: '"<<from1<<"', lcp="<<lcp1<<", cache="<<to_str(cache1)<<"\n"
	       <<"***********************\n";*/
	assert(lcp(latest, from0) == lcp0);
	assert(lcp(latest, from1) == lcp1);
	assert(get_char<CharT>(from0, lcp0) == cache0);
	assert(get_char<CharT>(from1, lcp1) == cache1);
}